

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestTestHandler::SetTestsProperties
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  size_t __n;
  char *__n_00;
  long *__s1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  cmCTest *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  mapped_type *pmVar9;
  ostream *poVar10;
  pointer pbVar11;
  size_type __rlen;
  long lVar12;
  string *cr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pcVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  pointer pbVar15;
  pointer __x;
  string *val;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view value;
  string_view value_00;
  string_view arg_03;
  string_view value_01;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  string_view value_02;
  string_view arg_07;
  string_view arg_08;
  string_view arg_09;
  string_view arg_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propArgs;
  long line;
  string mVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lval;
  undefined1 local_468 [16];
  pointer local_458;
  long local_450;
  undefined1 local_448 [32];
  _Alloc_hider local_428;
  size_type local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  long local_408;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_400;
  bool local_3e0;
  cmCTestTestHandler *local_3d8;
  pointer local_3d0;
  undefined1 local_3c8 [16];
  pointer local_3b8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_390;
  pointer local_388;
  pointer local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  cmListFileContext local_368;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [6];
  ios_base local_288 [600];
  
  local_3c8 = (undefined1  [16])0x0;
  local_3b8 = (pointer)0x0;
  __x = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_3d8 = this;
  if (__x != (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar7 = std::__cxx11::string::compare((char *)__x);
      if (iVar7 == 0) {
        local_3d0 = __x + 1;
        pbVar11 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (local_3d0 == pbVar11) goto LAB_001718bc;
        local_378 = 0x58455f52414c5547;
        uStack_370 = 0x4e4f495353455250;
        local_390 = args;
        goto LAB_00170a5e;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3c8,__x);
      __x = __x + 1;
    } while (__x != (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
  }
LAB_00170a0b:
  bVar6 = false;
  goto LAB_001718be;
LAB_00170a5e:
  do {
    val = __x + 2;
    if (val == pbVar11) break;
    local_388 = (pointer)local_3c8._8_8_;
    pbVar15 = (pointer)local_3c8._0_8_;
    if (local_3c8._0_8_ != local_3c8._8_8_) {
      do {
        pcVar14 = (local_3d8->TestList).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_380 = (local_3d8->TestList).
                    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (pcVar14 != local_380) {
          do {
            __n = pbVar15->_M_string_length;
            if ((__n == (pcVar14->Name)._M_string_length) &&
               (((__n == 0 ||
                 (iVar7 = bcmp((pbVar15->_M_dataplus)._M_p,(pcVar14->Name)._M_dataplus._M_p,__n),
                 iVar7 == 0)) &&
                (__n_00 = (char *)__x[1]._M_string_length, __n_00 + -4 < (char *)0x15)))) {
              __s1 = (long *)(local_3d0->_M_dataplus)._M_p;
              switch(__n_00) {
              case (char *)0x4:
                if ((int)*__s1 == 0x54534f43) {
                  dVar17 = atof((val->_M_dataplus)._M_p);
                  pcVar14->Cost = (float)dVar17;
                }
                break;
              case (char *)0x6:
                if (*(short *)((long)__s1 + 4) == 0x534c && (int)*__s1 == 0x4542414c) {
                  arg_03._M_str = __x[2]._M_dataplus._M_p;
                  arg_03._M_len = __x[2]._M_string_length;
                  cmExpandedList_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2f8,arg_03,false);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &pcVar14->Labels,
                             (pcVar14->Labels).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,local_2f8._0_8_,
                             local_2f8._8_8_);
                  std::
                  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((pcVar14->Labels).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (pcVar14->Labels).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                  __first = std::
                            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                                      ((pcVar14->Labels).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                       (pcVar14->Labels).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase(&pcVar14->Labels,(iterator)__first._M_current,
                             (pcVar14->Labels).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                  goto LAB_0017176f;
                }
                break;
              case (char *)0x7:
                if (*(int *)((long)__s1 + 3) == 0x54554f45 && (int)*__s1 == 0x454d4954) {
                  dVar17 = atof((val->_M_dataplus)._M_p);
                  (pcVar14->Timeout).__r = dVar17;
                  pcVar14->ExplicitTimeout = true;
                }
                else {
                  iVar7 = bcmp(__s1,"DEPENDS",(size_t)__n_00);
                  if (iVar7 == 0) {
                    lVar12 = 0x70;
                    goto LAB_001716a5;
                  }
                }
                break;
              case (char *)0x8:
                if (*__s1 == 0x44454c4241534944) {
                  value_01._M_str = __n_00;
                  value_01._M_len = (size_t)__x[2]._M_dataplus._M_p;
                  bVar6 = cmValue::IsOn((cmValue *)__x[2]._M_string_length,value_01);
                  pcVar14->Disabled = bVar6;
                }
                break;
              case (char *)0x9:
                if ((char)__s1[1] == 'L' && *__s1 == 0x4941465f4c4c4957) {
                  value._M_str = __n_00;
                  value._M_len = (size_t)__x[2]._M_dataplus._M_p;
                  bVar6 = cmValue::IsOn((cmValue *)__x[2]._M_string_length,value);
                  pcVar14->WillFail = bVar6;
                }
                break;
              case (char *)0xa:
                if ((short)__s1[1] == 0x4c41 && *__s1 == 0x495245535f4e5552) {
                  value_02._M_str = __n_00;
                  value_02._M_len = (size_t)__x[2]._M_dataplus._M_p;
                  bVar6 = cmValue::IsOn((cmValue *)__x[2]._M_string_length,value_02);
                  pcVar14->RunSerial = bVar6;
                }
                else if ((short)__s1[1] == 0x5352 && *__s1 == 0x4f535345434f5250) {
                  iVar7 = atoi((val->_M_dataplus)._M_p);
                  if (iVar7 < 2) {
                    iVar7 = 1;
                  }
                  pcVar14->Processors = iVar7;
                }
                break;
              case (char *)0xb:
                if (*(long *)((long)__s1 + 3) == 0x544e454d4e4f5249 && *__s1 == 0x4d4e4f5249564e45)
                {
                  lVar12 = 0x1a0;
                  goto LAB_001716a5;
                }
                if (*(long *)((long)__s1 + 3) == 0x544e454d45525553 && *__s1 == 0x4d4552555341454d)
                {
                  lVar12 = std::__cxx11::string::find((char)val,0x3d);
                  if (lVar12 == -1) {
                    pmVar9 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[](&pcVar14->Measurements,val);
                    std::__cxx11::string::operator=((string *)pmVar9,"1");
                  }
                  else {
                    std::__cxx11::string::substr((ulong)local_2f8,(ulong)val);
                    std::__cxx11::string::substr((ulong)local_448,(ulong)val);
                    pmVar9 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[](&pcVar14->Measurements,(key_type *)local_2f8);
                    std::__cxx11::string::operator=((string *)pmVar9,(string *)local_448);
                    if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_448._0_8_ !=
                        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_448 + 0x10)) {
                      operator_delete((void *)local_448._0_8_,
                                      CONCAT71(local_448._17_7_,local_448[0x10]) + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f8._0_8_ != local_2e8) {
                      operator_delete((void *)local_2f8._0_8_,
                                      (ulong)(local_2e8[0]._M_allocated_capacity + 1));
                    }
                  }
                }
                break;
              case (char *)0xd:
                iVar7 = bcmp(__s1,"RESOURCE_LOCK",(size_t)__n_00);
                if (iVar7 == 0) {
                  arg_04._M_str = __x[2]._M_dataplus._M_p;
                  arg_04._M_len = __x[2]._M_string_length;
                  cmExpandedList_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2f8,arg_04,false);
                  uVar2 = local_2f8._8_8_;
                  local_448._0_8_ = &pcVar14->LockedResources;
                  if (local_2f8._0_8_ != local_2f8._8_8_) {
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2f8._0_8_;
                    do {
                      std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::
                      _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)&pcVar14->LockedResources,
                                 (const_iterator)
                                 &(pcVar14->LockedResources)._M_t._M_impl.super__Rb_tree_header,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)paVar13,(_Alloc_node *)local_448);
                      paVar13 = paVar13 + 2;
                    } while (paVar13 !=
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)uVar2);
                  }
                  goto LAB_0017176f;
                }
                break;
              case (char *)0xe:
                if (*(long *)((long)__s1 + 6) == 0x53454c49465f4445 && *__s1 == 0x4445484341545441)
                {
                  lVar12 = 0x88;
                }
                else {
                  if (*(long *)((long)__s1 + 6) == 0x50555445535f5345 && *__s1 == 0x5345525554584946
                     ) {
                    arg_10._M_str = __x[2]._M_dataplus._M_p;
                    arg_10._M_len = __x[2]._M_string_length;
                    cmExpandedList_abi_cxx11_
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2f8,arg_10,false);
                    uVar2 = local_2f8._8_8_;
                    local_448._0_8_ = &pcVar14->FixturesSetup;
                    if (local_2f8._0_8_ != local_2f8._8_8_) {
                      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2f8._0_8_;
                      do {
                        std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::
                        _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    *)&pcVar14->FixturesSetup,
                                   (const_iterator)
                                   &(pcVar14->FixturesSetup)._M_t._M_impl.super__Rb_tree_header,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)paVar13,(_Alloc_node *)local_448);
                        paVar13 = paVar13 + 2;
                      } while (paVar13 !=
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)uVar2);
                    }
                    goto LAB_0017176f;
                  }
                  iVar7 = bcmp(__s1,"REQUIRED_FILES",(size_t)__n_00);
                  if (iVar7 != 0) break;
                  lVar12 = 0x58;
                }
LAB_001716a5:
                arg_00._M_str = __x[2]._M_dataplus._M_p;
                arg_00._M_len = __x[2]._M_string_length;
                cmExpandList(arg_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)((long)&(pcVar14->Name)._M_dataplus._M_p + lVar12),false);
                break;
              case (char *)0xf:
                if ((*(long *)((long)__s1 + 7) == 0x5350554f52475f45 && *__s1 == 0x454352554f534552)
                   && (bVar6 = ParseResourceGroupsProperty(val,&pcVar14->ResourceGroups), !bVar6))
                goto LAB_00170a0b;
                break;
              case (char *)0x10:
                auVar19[0] = -((char)*__s1 == 'F');
                auVar19[1] = -(*(char *)((long)__s1 + 1) == 'I');
                auVar19[2] = -(*(char *)((long)__s1 + 2) == 'X');
                auVar19[3] = -(*(char *)((long)__s1 + 3) == 'T');
                auVar19[4] = -(*(char *)((long)__s1 + 4) == 'U');
                auVar19[5] = -(*(char *)((long)__s1 + 5) == 'R');
                auVar19[6] = -(*(char *)((long)__s1 + 6) == 'E');
                auVar19[7] = -(*(char *)((long)__s1 + 7) == 'S');
                auVar19[8] = -((char)__s1[1] == '_');
                auVar19[9] = -(*(char *)((long)__s1 + 9) == 'C');
                auVar19[10] = -(*(char *)((long)__s1 + 10) == 'L');
                auVar19[0xb] = -(*(char *)((long)__s1 + 0xb) == 'E');
                auVar19[0xc] = -(*(char *)((long)__s1 + 0xc) == 'A');
                auVar19[0xd] = -(*(char *)((long)__s1 + 0xd) == 'N');
                auVar19[0xe] = -(*(char *)((long)__s1 + 0xe) == 'U');
                auVar19[0xf] = -(*(char *)((long)__s1 + 0xf) == 'P');
                if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar19[0xf] >> 7) << 0xf) == 0xffff) {
                  arg_06._M_str = __x[2]._M_dataplus._M_p;
                  arg_06._M_len = __x[2]._M_string_length;
                  cmExpandedList_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2f8,arg_06,false);
                  uVar2 = local_2f8._8_8_;
                  local_448._0_8_ = &pcVar14->FixturesCleanup;
                  if (local_2f8._0_8_ != local_2f8._8_8_) {
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2f8._0_8_;
                    do {
                      std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::
                      _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)&pcVar14->FixturesCleanup,
                                 (const_iterator)
                                 &(pcVar14->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)paVar13,(_Alloc_node *)local_448);
                      paVar13 = paVar13 + 2;
                    } while (paVar13 !=
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)uVar2);
                  }
                  goto LAB_0017176f;
                }
                iVar7 = bcmp(__s1,"SKIP_RETURN_CODE",(size_t)__n_00);
                if (iVar7 == 0) {
                  uVar8 = atoi((val->_M_dataplus)._M_p);
                  if (0xff < uVar8) {
                    uVar8 = 0xffffffff;
                  }
                  pcVar14->SkipReturnCode = uVar8;
                }
                break;
              case (char *)0x11:
                auVar22[0] = -((char)*__s1 == 'F');
                auVar22[1] = -(*(char *)((long)__s1 + 1) == 'I');
                auVar22[2] = -(*(char *)((long)__s1 + 2) == 'X');
                auVar22[3] = -(*(char *)((long)__s1 + 3) == 'T');
                auVar22[4] = -(*(char *)((long)__s1 + 4) == 'U');
                auVar22[5] = -(*(char *)((long)__s1 + 5) == 'R');
                auVar22[6] = -(*(char *)((long)__s1 + 6) == 'E');
                auVar22[7] = -(*(char *)((long)__s1 + 7) == 'S');
                auVar22[8] = -((char)__s1[1] == '_');
                auVar22[9] = -(*(char *)((long)__s1 + 9) == 'R');
                auVar22[10] = -(*(char *)((long)__s1 + 10) == 'E');
                auVar22[0xb] = -(*(char *)((long)__s1 + 0xb) == 'Q');
                auVar22[0xc] = -(*(char *)((long)__s1 + 0xc) == 'U');
                auVar22[0xd] = -(*(char *)((long)__s1 + 0xd) == 'I');
                auVar22[0xe] = -(*(char *)((long)__s1 + 0xe) == 'R');
                auVar22[0xf] = -(*(char *)((long)__s1 + 0xf) == 'E');
                auVar30[0] = -((char)__s1[2] == 'D');
                auVar30[1] = 0xff;
                auVar30[2] = 0xff;
                auVar30[3] = 0xff;
                auVar30[4] = 0xff;
                auVar30[5] = 0xff;
                auVar30[6] = 0xff;
                auVar30[7] = 0xff;
                auVar30[8] = 0xff;
                auVar30[9] = 0xff;
                auVar30[10] = 0xff;
                auVar30[0xb] = 0xff;
                auVar30[0xc] = 0xff;
                auVar30[0xd] = 0xff;
                auVar30[0xe] = 0xff;
                auVar30[0xf] = 0xff;
                auVar30 = auVar30 & auVar22;
                if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff) {
                  arg_07._M_str = __x[2]._M_dataplus._M_p;
                  arg_07._M_len = __x[2]._M_string_length;
                  cmExpandedList_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2f8,arg_07,false);
                  uVar2 = local_2f8._8_8_;
                  local_448._0_8_ = &pcVar14->FixturesRequired;
                  if (local_2f8._0_8_ != local_2f8._8_8_) {
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2f8._0_8_;
                    do {
                      std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::
                      _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)&pcVar14->FixturesRequired,
                                 (const_iterator)
                                 &(pcVar14->FixturesRequired)._M_t._M_impl.super__Rb_tree_header,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)paVar13,(_Alloc_node *)local_448);
                      paVar13 = paVar13 + 2;
                    } while (paVar13 !=
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)uVar2);
                  }
                  goto LAB_0017176f;
                }
                iVar7 = bcmp(__s1,"WORKING_DIRECTORY",(size_t)__n_00);
                if (iVar7 == 0) {
                  std::__cxx11::string::_M_assign((string *)&pcVar14->Directory);
                }
                break;
              case (char *)0x12:
                auVar20[0] = -((char)*__s1 == '_');
                auVar20[1] = -(*(char *)((long)__s1 + 1) == 'B');
                auVar20[2] = -(*(char *)((long)__s1 + 2) == 'A');
                auVar20[3] = -(*(char *)((long)__s1 + 3) == 'C');
                auVar20[4] = -(*(char *)((long)__s1 + 4) == 'K');
                auVar20[5] = -(*(char *)((long)__s1 + 5) == 'T');
                auVar20[6] = -(*(char *)((long)__s1 + 6) == 'R');
                auVar20[7] = -(*(char *)((long)__s1 + 7) == 'A');
                auVar20[8] = -((char)__s1[1] == 'C');
                auVar20[9] = -(*(char *)((long)__s1 + 9) == 'E');
                auVar20[10] = -(*(char *)((long)__s1 + 10) == '_');
                auVar20[0xb] = -(*(char *)((long)__s1 + 0xb) == 'T');
                auVar20[0xc] = -(*(char *)((long)__s1 + 0xc) == 'R');
                auVar20[0xd] = -(*(char *)((long)__s1 + 0xd) == 'I');
                auVar20[0xe] = -(*(char *)((long)__s1 + 0xe) == 'P');
                auVar20[0xf] = -(*(char *)((long)__s1 + 0xf) == 'L');
                auVar28[0] = -((char)(short)__s1[2] == 'E');
                auVar28[1] = -((char)((ushort)(short)__s1[2] >> 8) == 'S');
                auVar28[2] = 0xff;
                auVar28[3] = 0xff;
                auVar28[4] = 0xff;
                auVar28[5] = 0xff;
                auVar28[6] = 0xff;
                auVar28[7] = 0xff;
                auVar28[8] = 0xff;
                auVar28[9] = 0xff;
                auVar28[10] = 0xff;
                auVar28[0xb] = 0xff;
                auVar28[0xc] = 0xff;
                auVar28[0xd] = 0xff;
                auVar28[0xe] = 0xff;
                auVar28[0xf] = 0xff;
                auVar28 = auVar28 & auVar20;
                if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff) {
                  local_468 = (undefined1  [16])0x0;
                  local_458 = (pointer)0x0;
                  arg._M_str = __x[2]._M_dataplus._M_p;
                  arg._M_len = __x[2]._M_string_length;
                  cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_468,true);
                  if ((ulong)(((long)(local_468._8_8_ - local_468._0_8_) >> 5) * -0x5555555555555555
                             ) < 0x5555555555555556) {
                    cmState::cmState((cmState *)local_2f8,Unknown,Normal);
                    local_448._0_8_ = (element_type *)0x0;
                    local_448._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_448);
                    uVar2 = local_448._0_8_;
                    uVar3 = local_448._8_8_;
                    local_448._0_8_ = (element_type *)0x0;
                    local_448._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var1 = (pcVar14->Backtrace).
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (pcVar14->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar2;
                    (pcVar14->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
                    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._8_8_);
                      }
                    }
                    uVar16 = (long)(local_468._8_8_ - local_468._0_8_) >> 5;
                    if (2 < uVar16) {
                      lVar12 = local_468._8_8_ - local_468._0_8_;
                      do {
                        local_448._8_8_ = 0;
                        local_448._0_8_ = local_448 + 0x10;
                        local_448[0x10] = '\0';
                        local_428._M_p = (pointer)&local_418;
                        local_420 = 0;
                        local_418._M_local_buf[0] = '\0';
                        local_408 = 0;
                        local_3e0 = false;
                        std::__cxx11::string::_M_assign((string *)&local_428);
                        local_450 = 0;
                        bVar6 = cmStrToLong((string *)
                                            ((long)&(((pointer)(local_468._0_8_ + -0x40))->
                                                    _M_dataplus)._M_p + lVar12),&local_450);
                        if (!bVar6) {
                          local_450 = 0;
                        }
                        local_408 = local_450;
                        std::__cxx11::string::_M_assign((string *)local_448);
                        cmListFileContext::cmListFileContext
                                  (&local_368,(cmListFileContext *)local_448);
                        cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)
                                   &local_3a8,(cmListFileContext *)&pcVar14->Backtrace);
                        peVar4 = local_3a8._M_ptr;
                        _Var5._M_pi = local_3a8._M_refcount._M_pi;
                        local_3a8._M_ptr = (element_type *)0x0;
                        local_3a8._M_refcount._M_pi =
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        p_Var1 = (pcVar14->Backtrace).
                                 super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                                 .
                                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                        (pcVar14->Backtrace).
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = peVar4;
                        (pcVar14->Backtrace).
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi = _Var5._M_pi;
                        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
                          if (local_3a8._M_refcount._M_pi !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      (local_3a8._M_refcount._M_pi);
                          }
                        }
                        if ((local_368.DeferId.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_engaged == true) &&
                           (local_368.DeferId.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_engaged = false,
                           local_368.DeferId.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_dataplus._M_p !=
                           ((pointer)
                           ((long)&local_368.DeferId.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           + 0x10U))._M_p)) {
                          operator_delete((void *)local_368.DeferId.
                                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ._M_payload._M_value._M_dataplus._M_p,
                                          local_368.DeferId.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._M_payload._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_368.FilePath._M_dataplus._M_p != &local_368.FilePath.field_2) {
                          operator_delete(local_368.FilePath._M_dataplus._M_p,
                                          local_368.FilePath.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_368.Name._M_dataplus._M_p != &local_368.Name.field_2) {
                          operator_delete(local_368.Name._M_dataplus._M_p,
                                          local_368.Name.field_2._M_allocated_capacity + 1);
                        }
                        if ((local_3e0 == true) &&
                           (local_3e0 = false,
                           local_400._M_value._M_dataplus._M_p !=
                           (_Alloc_hider)((long)&local_400._M_value + 0x10))) {
                          operator_delete((void *)local_400._M_value._M_dataplus._M_p,
                                          local_400._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_428._M_p != &local_418) {
                          operator_delete(local_428._M_p,
                                          CONCAT71(local_418._M_allocated_capacity._1_7_,
                                                   local_418._M_local_buf[0]) + 1);
                        }
                        if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_448._0_8_ !=
                            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_448 + 0x10)) {
                          operator_delete((void *)local_448._0_8_,
                                          CONCAT71(local_448._17_7_,local_448[0x10]) + 1);
                        }
                        uVar16 = uVar16 - 3;
                        lVar12 = lVar12 + -0x60;
                      } while (2 < uVar16);
                    }
                    cmState::~cmState((cmState *)local_2f8);
                  }
LAB_0017183f:
                  this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_468;
                  goto LAB_00171844;
                }
                auVar21[0] = -((char)*__s1 == 'P');
                auVar21[1] = -(*(char *)((long)__s1 + 1) == 'R');
                auVar21[2] = -(*(char *)((long)__s1 + 2) == 'O');
                auVar21[3] = -(*(char *)((long)__s1 + 3) == 'C');
                auVar21[4] = -(*(char *)((long)__s1 + 4) == 'E');
                auVar21[5] = -(*(char *)((long)__s1 + 5) == 'S');
                auVar21[6] = -(*(char *)((long)__s1 + 6) == 'S');
                auVar21[7] = -(*(char *)((long)__s1 + 7) == 'O');
                auVar21[8] = -((char)__s1[1] == 'R');
                auVar21[9] = -(*(char *)((long)__s1 + 9) == '_');
                auVar21[10] = -(*(char *)((long)__s1 + 10) == 'A');
                auVar21[0xb] = -(*(char *)((long)__s1 + 0xb) == 'F');
                auVar21[0xc] = -(*(char *)((long)__s1 + 0xc) == 'F');
                auVar21[0xd] = -(*(char *)((long)__s1 + 0xd) == 'I');
                auVar21[0xe] = -(*(char *)((long)__s1 + 0xe) == 'N');
                auVar21[0xf] = -(*(char *)((long)__s1 + 0xf) == 'I');
                auVar29[0] = -((char)(short)__s1[2] == 'T');
                auVar29[1] = -((char)((ushort)(short)__s1[2] >> 8) == 'Y');
                auVar29[2] = 0xff;
                auVar29[3] = 0xff;
                auVar29[4] = 0xff;
                auVar29[5] = 0xff;
                auVar29[6] = 0xff;
                auVar29[7] = 0xff;
                auVar29[8] = 0xff;
                auVar29[9] = 0xff;
                auVar29[10] = 0xff;
                auVar29[0xb] = 0xff;
                auVar29[0xc] = 0xff;
                auVar29[0xd] = 0xff;
                auVar29[0xe] = 0xff;
                auVar29[0xf] = 0xff;
                auVar29 = auVar29 & auVar21;
                if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff) {
                  value_00._M_str = __n_00;
                  value_00._M_len = (size_t)__x[2]._M_dataplus._M_p;
                  bVar6 = cmValue::IsOn((cmValue *)__x[2]._M_string_length,value_00);
                  pcVar14->WantAffinity = bVar6;
                }
                break;
              case (char *)0x13:
                auVar18[0] = -((char)*__s1 == 'T');
                auVar18[1] = -(*(char *)((long)__s1 + 1) == 'I');
                auVar18[2] = -(*(char *)((long)__s1 + 2) == 'M');
                auVar18[3] = -(*(char *)((long)__s1 + 3) == 'E');
                auVar18[4] = -(*(char *)((long)__s1 + 4) == 'O');
                auVar18[5] = -(*(char *)((long)__s1 + 5) == 'U');
                auVar18[6] = -(*(char *)((long)__s1 + 6) == 'T');
                auVar18[7] = -(*(char *)((long)__s1 + 7) == '_');
                auVar18[8] = -((char)__s1[1] == 'A');
                auVar18[9] = -(*(char *)((long)__s1 + 9) == 'F');
                auVar18[10] = -(*(char *)((long)__s1 + 10) == 'T');
                auVar18[0xb] = -(*(char *)((long)__s1 + 0xb) == 'E');
                auVar18[0xc] = -(*(char *)((long)__s1 + 0xc) == 'R');
                auVar18[0xd] = -(*(char *)((long)__s1 + 0xd) == '_');
                auVar18[0xe] = -(*(char *)((long)__s1 + 0xe) == 'M');
                auVar18[0xf] = -(*(char *)((long)__s1 + 0xf) == 'A');
                auVar27[0] = -(*(char *)((long)__s1 + 3) == 'E');
                auVar27[1] = -(*(char *)((long)__s1 + 4) == 'O');
                auVar27[2] = -(*(char *)((long)__s1 + 5) == 'U');
                auVar27[3] = -(*(char *)((long)__s1 + 6) == 'T');
                auVar27[4] = -(*(char *)((long)__s1 + 7) == '_');
                auVar27[5] = -((char)__s1[1] == 'A');
                auVar27[6] = -(*(char *)((long)__s1 + 9) == 'F');
                auVar27[7] = -(*(char *)((long)__s1 + 10) == 'T');
                auVar27[8] = -(*(char *)((long)__s1 + 0xb) == 'E');
                auVar27[9] = -(*(char *)((long)__s1 + 0xc) == 'R');
                auVar27[10] = -(*(char *)((long)__s1 + 0xd) == '_');
                auVar27[0xb] = -(*(char *)((long)__s1 + 0xe) == 'M');
                auVar27[0xc] = -(*(char *)((long)__s1 + 0xf) == 'A');
                auVar27[0xd] = -((char)__s1[2] == 'T');
                auVar27[0xe] = -(*(char *)((long)__s1 + 0x11) == 'C');
                auVar27[0xf] = -(*(char *)((long)__s1 + 0x12) == 'H');
                auVar27 = auVar27 & auVar18;
                if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff) {
                  arg_01._M_str = __x[2]._M_dataplus._M_p;
                  arg_01._M_len = __x[2]._M_string_length;
                  cmExpandedList_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_468,arg_01,false);
                  uVar2 = local_468._0_8_;
                  if (local_468._8_8_ - local_468._0_8_ == 0x40) {
                    dVar17 = atof(((_Alloc_hider *)local_468._0_8_)->_M_p);
                    (pcVar14->AlternateTimeout).__r = dVar17;
                    arg_02._M_str = (((pointer)(uVar2 + 0x20))->_M_dataplus)._M_p;
                    arg_02._M_len = ((pointer)(uVar2 + 0x20))->_M_string_length;
                    cmExpandedList_abi_cxx11_
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2f8,arg_02,false);
                    uVar2 = local_2f8._8_8_;
                    if (local_2f8._0_8_ != local_2f8._8_8_) {
                      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2f8._0_8_;
                      do {
                        std::
                        vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                        ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                  ((vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                    *)&pcVar14->TimeoutRegularExpressions,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)paVar13,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)paVar13);
                        paVar13 = paVar13 + 2;
                      } while (paVar13 !=
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)uVar2);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2f8);
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,
                               "TIMEOUT_AFTER_MATCH expects two arguments, found ",0x31);
                    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_2f8);
                    std::endl<char,std::char_traits<char>>(poVar10);
                    this_00 = (local_3d8->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(this_00,6,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                                 ,0x912,(char *)local_448._0_8_,false);
                    if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_448._0_8_ !=
                        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_448 + 0x10)) {
                      operator_delete((void *)local_448._0_8_,
                                      CONCAT71(local_448._17_7_,local_448[0x10]) + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                    std::ios_base::~ios_base(local_288);
                  }
                  goto LAB_0017183f;
                }
                break;
              case (char *)0x16:
                auVar23[0] = -((char)*__s1 == 'A');
                auVar23[1] = -(*(char *)((long)__s1 + 1) == 'T');
                auVar23[2] = -(*(char *)((long)__s1 + 2) == 'T');
                auVar23[3] = -(*(char *)((long)__s1 + 3) == 'A');
                auVar23[4] = -(*(char *)((long)__s1 + 4) == 'C');
                auVar23[5] = -(*(char *)((long)__s1 + 5) == 'H');
                auVar23[6] = -(*(char *)((long)__s1 + 6) == 'E');
                auVar23[7] = -(*(char *)((long)__s1 + 7) == 'D');
                auVar23[8] = -((char)__s1[1] == '_');
                auVar23[9] = -(*(char *)((long)__s1 + 9) == 'F');
                auVar23[10] = -(*(char *)((long)__s1 + 10) == 'I');
                auVar23[0xb] = -(*(char *)((long)__s1 + 0xb) == 'L');
                auVar23[0xc] = -(*(char *)((long)__s1 + 0xc) == 'E');
                auVar23[0xd] = -(*(char *)((long)__s1 + 0xd) == 'S');
                auVar23[0xe] = -(*(char *)((long)__s1 + 0xe) == '_');
                auVar23[0xf] = -(*(char *)((long)__s1 + 0xf) == 'O');
                auVar31[0] = -(*(char *)((long)__s1 + 6) == 'E');
                auVar31[1] = -(*(char *)((long)__s1 + 7) == 'D');
                auVar31[2] = -((char)__s1[1] == '_');
                auVar31[3] = -(*(char *)((long)__s1 + 9) == 'F');
                auVar31[4] = -(*(char *)((long)__s1 + 10) == 'I');
                auVar31[5] = -(*(char *)((long)__s1 + 0xb) == 'L');
                auVar31[6] = -(*(char *)((long)__s1 + 0xc) == 'E');
                auVar31[7] = -(*(char *)((long)__s1 + 0xd) == 'S');
                auVar31[8] = -(*(char *)((long)__s1 + 0xe) == '_');
                auVar31[9] = -(*(char *)((long)__s1 + 0xf) == 'O');
                auVar31[10] = -((char)__s1[2] == 'N');
                auVar31[0xb] = -(*(char *)((long)__s1 + 0x11) == '_');
                auVar31[0xc] = -(*(char *)((long)__s1 + 0x12) == 'F');
                auVar31[0xd] = -(*(char *)((long)__s1 + 0x13) == 'A');
                auVar31[0xe] = -(*(char *)((long)__s1 + 0x14) == 'I');
                auVar31[0xf] = -(*(char *)((long)__s1 + 0x15) == 'L');
                auVar31 = auVar31 & auVar23;
                if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) == 0xffff) {
                  lVar12 = 0xa0;
                  goto LAB_001716a5;
                }
                break;
              case (char *)0x17:
                auVar24[0] = -((char)*__s1 == 'F');
                auVar24[1] = -(*(char *)((long)__s1 + 1) == 'A');
                auVar24[2] = -(*(char *)((long)__s1 + 2) == 'I');
                auVar24[3] = -(*(char *)((long)__s1 + 3) == 'L');
                auVar24[4] = -(*(char *)((long)__s1 + 4) == '_');
                auVar24[5] = -(*(char *)((long)__s1 + 5) == 'R');
                auVar24[6] = -(*(char *)((long)__s1 + 6) == 'E');
                auVar24[7] = -(*(char *)((long)__s1 + 7) == 'G');
                auVar24[8] = -((char)__s1[1] == 'U');
                auVar24[9] = -(*(char *)((long)__s1 + 9) == 'L');
                auVar24[10] = -(*(char *)((long)__s1 + 10) == 'A');
                auVar24[0xb] = -(*(char *)((long)__s1 + 0xb) == 'R');
                auVar24[0xc] = -(*(char *)((long)__s1 + 0xc) == '_');
                auVar24[0xd] = -(*(char *)((long)__s1 + 0xd) == 'E');
                auVar24[0xe] = -(*(char *)((long)__s1 + 0xe) == 'X');
                auVar24[0xf] = -(*(char *)((long)__s1 + 0xf) == 'P');
                auVar32[0] = -(*(char *)((long)__s1 + 7) == (char)local_378);
                auVar32[1] = -((char)__s1[1] == local_378._1_1_);
                auVar32[2] = -(*(char *)((long)__s1 + 9) == local_378._2_1_);
                auVar32[3] = -(*(char *)((long)__s1 + 10) == local_378._3_1_);
                auVar32[4] = -(*(char *)((long)__s1 + 0xb) == local_378._4_1_);
                auVar32[5] = -(*(char *)((long)__s1 + 0xc) == local_378._5_1_);
                auVar32[6] = -(*(char *)((long)__s1 + 0xd) == local_378._6_1_);
                auVar32[7] = -(*(char *)((long)__s1 + 0xe) == local_378._7_1_);
                auVar32[8] = -(*(char *)((long)__s1 + 0xf) == (char)uStack_370);
                auVar32[9] = -((char)__s1[2] == uStack_370._1_1_);
                auVar32[10] = -(*(char *)((long)__s1 + 0x11) == uStack_370._2_1_);
                auVar32[0xb] = -(*(char *)((long)__s1 + 0x12) == uStack_370._3_1_);
                auVar32[0xc] = -(*(char *)((long)__s1 + 0x13) == uStack_370._4_1_);
                auVar32[0xd] = -(*(char *)((long)__s1 + 0x14) == uStack_370._5_1_);
                auVar32[0xe] = -(*(char *)((long)__s1 + 0x15) == uStack_370._6_1_);
                auVar32[0xf] = -(*(char *)((long)__s1 + 0x16) == uStack_370._7_1_);
                auVar32 = auVar32 & auVar24;
                if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff) {
                  arg_08._M_str = __x[2]._M_dataplus._M_p;
                  arg_08._M_len = __x[2]._M_string_length;
                  cmExpandedList_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2f8,arg_08,false);
                  uVar2 = local_2f8._8_8_;
                  if (local_2f8._0_8_ != local_2f8._8_8_) {
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2f8._0_8_;
                    do {
                      std::
                      vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                      ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                ((vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                  *)&pcVar14->ErrorRegularExpressions,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)paVar13,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)paVar13);
                      paVar13 = paVar13 + 2;
                    } while (paVar13 !=
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)uVar2);
                  }
                }
                else {
                  auVar25[0] = -((char)*__s1 == 'S');
                  auVar25[1] = -(*(char *)((long)__s1 + 1) == 'K');
                  auVar25[2] = -(*(char *)((long)__s1 + 2) == 'I');
                  auVar25[3] = -(*(char *)((long)__s1 + 3) == 'P');
                  auVar25[4] = -(*(char *)((long)__s1 + 4) == '_');
                  auVar25[5] = -(*(char *)((long)__s1 + 5) == 'R');
                  auVar25[6] = -(*(char *)((long)__s1 + 6) == 'E');
                  auVar25[7] = -(*(char *)((long)__s1 + 7) == 'G');
                  auVar25[8] = -((char)__s1[1] == 'U');
                  auVar25[9] = -(*(char *)((long)__s1 + 9) == 'L');
                  auVar25[10] = -(*(char *)((long)__s1 + 10) == 'A');
                  auVar25[0xb] = -(*(char *)((long)__s1 + 0xb) == 'R');
                  auVar25[0xc] = -(*(char *)((long)__s1 + 0xc) == '_');
                  auVar25[0xd] = -(*(char *)((long)__s1 + 0xd) == 'E');
                  auVar25[0xe] = -(*(char *)((long)__s1 + 0xe) == 'X');
                  auVar25[0xf] = -(*(char *)((long)__s1 + 0xf) == 'P');
                  auVar33[0] = -(*(char *)((long)__s1 + 7) == (char)local_378);
                  auVar33[1] = -((char)__s1[1] == local_378._1_1_);
                  auVar33[2] = -(*(char *)((long)__s1 + 9) == local_378._2_1_);
                  auVar33[3] = -(*(char *)((long)__s1 + 10) == local_378._3_1_);
                  auVar33[4] = -(*(char *)((long)__s1 + 0xb) == local_378._4_1_);
                  auVar33[5] = -(*(char *)((long)__s1 + 0xc) == local_378._5_1_);
                  auVar33[6] = -(*(char *)((long)__s1 + 0xd) == local_378._6_1_);
                  auVar33[7] = -(*(char *)((long)__s1 + 0xe) == local_378._7_1_);
                  auVar33[8] = -(*(char *)((long)__s1 + 0xf) == (char)uStack_370);
                  auVar33[9] = -((char)__s1[2] == uStack_370._1_1_);
                  auVar33[10] = -(*(char *)((long)__s1 + 0x11) == uStack_370._2_1_);
                  auVar33[0xb] = -(*(char *)((long)__s1 + 0x12) == uStack_370._3_1_);
                  auVar33[0xc] = -(*(char *)((long)__s1 + 0x13) == uStack_370._4_1_);
                  auVar33[0xd] = -(*(char *)((long)__s1 + 0x14) == uStack_370._5_1_);
                  auVar33[0xe] = -(*(char *)((long)__s1 + 0x15) == uStack_370._6_1_);
                  auVar33[0xf] = -(*(char *)((long)__s1 + 0x16) == uStack_370._7_1_);
                  auVar33 = auVar33 & auVar25;
                  if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff) {
                    arg_09._M_str = __x[2]._M_dataplus._M_p;
                    arg_09._M_len = __x[2]._M_string_length;
                    cmExpandedList_abi_cxx11_
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2f8,arg_09,false);
                    uVar2 = local_2f8._8_8_;
                    if (local_2f8._0_8_ != local_2f8._8_8_) {
                      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2f8._0_8_;
                      do {
                        std::
                        vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                        ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                  ((vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                    *)&pcVar14->SkipRegularExpressions,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)paVar13,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)paVar13);
                        paVar13 = paVar13 + 2;
                      } while (paVar13 !=
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)uVar2);
                    }
                  }
                  else {
                    iVar7 = bcmp(__s1,"PASS_REGULAR_EXPRESSION",(size_t)__n_00);
                    if (iVar7 != 0) break;
                    arg_05._M_str = __x[2]._M_dataplus._M_p;
                    arg_05._M_len = __x[2]._M_string_length;
                    cmExpandedList_abi_cxx11_
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2f8,arg_05,false);
                    uVar2 = local_2f8._8_8_;
                    if (local_2f8._0_8_ != local_2f8._8_8_) {
                      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2f8._0_8_;
                      do {
                        std::
                        vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                        ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                  ((vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                    *)&pcVar14->RequiredRegularExpressions,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)paVar13,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)paVar13);
                        paVar13 = paVar13 + 2;
                      } while (paVar13 !=
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)uVar2);
                    }
                  }
                }
LAB_0017176f:
                this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2f8;
LAB_00171844:
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(this_01);
                break;
              case (char *)0x18:
                auVar26[0] = -((char)*__s1 == 'E');
                auVar26[1] = -(*(char *)((long)__s1 + 1) == 'N');
                auVar26[2] = -(*(char *)((long)__s1 + 2) == 'V');
                auVar26[3] = -(*(char *)((long)__s1 + 3) == 'I');
                auVar26[4] = -(*(char *)((long)__s1 + 4) == 'R');
                auVar26[5] = -(*(char *)((long)__s1 + 5) == 'O');
                auVar26[6] = -(*(char *)((long)__s1 + 6) == 'N');
                auVar26[7] = -(*(char *)((long)__s1 + 7) == 'M');
                auVar26[8] = -((char)__s1[1] == 'E');
                auVar26[9] = -(*(char *)((long)__s1 + 9) == 'N');
                auVar26[10] = -(*(char *)((long)__s1 + 10) == 'T');
                auVar26[0xb] = -(*(char *)((long)__s1 + 0xb) == '_');
                auVar26[0xc] = -(*(char *)((long)__s1 + 0xc) == 'M');
                auVar26[0xd] = -(*(char *)((long)__s1 + 0xd) == 'O');
                auVar26[0xe] = -(*(char *)((long)__s1 + 0xe) == 'D');
                auVar26[0xf] = -(*(char *)((long)__s1 + 0xf) == 'I');
                lVar12 = __s1[2];
                auVar34[0] = -((char)lVar12 == 'F');
                auVar34[1] = -((char)((ulong)lVar12 >> 8) == 'I');
                auVar34[2] = -((char)((ulong)lVar12 >> 0x10) == 'C');
                auVar34[3] = -((char)((ulong)lVar12 >> 0x18) == 'A');
                auVar34[4] = -((char)((ulong)lVar12 >> 0x20) == 'T');
                auVar34[5] = -((char)((ulong)lVar12 >> 0x28) == 'I');
                auVar34[6] = -((char)((ulong)lVar12 >> 0x30) == 'O');
                auVar34[7] = -((char)((ulong)lVar12 >> 0x38) == 'N');
                auVar34[8] = 0xff;
                auVar34[9] = 0xff;
                auVar34[10] = 0xff;
                auVar34[0xb] = 0xff;
                auVar34[0xc] = 0xff;
                auVar34[0xd] = 0xff;
                auVar34[0xe] = 0xff;
                auVar34[0xf] = 0xff;
                auVar34 = auVar34 & auVar26;
                if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff) {
                  lVar12 = 0x1b8;
                  goto LAB_001716a5;
                }
              }
            }
            pcVar14 = pcVar14 + 1;
          } while (pcVar14 != local_380);
        }
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != local_388);
      pbVar11 = (local_390->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    }
    local_3d0 = __x + 3;
    __x = val;
  } while (local_3d0 != pbVar11);
LAB_001718bc:
  bVar6 = true;
LAB_001718be:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c8);
  return bVar6;
}

Assistant:

bool cmCTestTestHandler::SetTestsProperties(
  const std::vector<std::string>& args)
{
  std::vector<std::string>::const_iterator it;
  std::vector<std::string> tests;
  bool found = false;
  for (it = args.begin(); it != args.end(); ++it) {
    if (*it == "PROPERTIES") {
      found = true;
      break;
    }
    tests.push_back(*it);
  }
  if (!found) {
    return false;
  }
  ++it; // skip PROPERTIES
  for (; it != args.end(); ++it) {
    std::string const& key = *it;
    ++it;
    if (it == args.end()) {
      break;
    }
    std::string const& val = *it;
    for (std::string const& t : tests) {
      for (cmCTestTestProperties& rt : this->TestList) {
        if (t == rt.Name) {
          if (key == "_BACKTRACE_TRIPLES"_s) {
            std::vector<std::string> triples;
            // allow empty args in the triples
            cmExpandList(val, triples, true);

            // Ensure we have complete triples otherwise the data is corrupt.
            if (triples.size() % 3 == 0) {
              cmState state(cmState::Unknown);
              rt.Backtrace = cmListFileBacktrace();

              // the first entry represents the top of the trace so we need to
              // reconstruct the backtrace in reverse
              for (size_t i = triples.size(); i >= 3; i -= 3) {
                cmListFileContext fc;
                fc.FilePath = triples[i - 3];
                long line = 0;
                if (!cmStrToLong(triples[i - 2], &line)) {
                  line = 0;
                }
                fc.Line = line;
                fc.Name = triples[i - 1];
                rt.Backtrace = rt.Backtrace.Push(fc);
              }
            }
          } else if (key == "WILL_FAIL"_s) {
            rt.WillFail = cmIsOn(val);
          } else if (key == "DISABLED"_s) {
            rt.Disabled = cmIsOn(val);
          } else if (key == "ATTACHED_FILES"_s) {
            cmExpandList(val, rt.AttachedFiles);
          } else if (key == "ATTACHED_FILES_ON_FAIL"_s) {
            cmExpandList(val, rt.AttachOnFail);
          } else if (key == "RESOURCE_LOCK"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.LockedResources.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_SETUP"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesSetup.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_CLEANUP"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesCleanup.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_REQUIRED"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesRequired.insert(lval.begin(), lval.end());
          } else if (key == "TIMEOUT"_s) {
            rt.Timeout = cmDuration(atof(val.c_str()));
            rt.ExplicitTimeout = true;
          } else if (key == "COST"_s) {
            rt.Cost = static_cast<float>(atof(val.c_str()));
          } else if (key == "REQUIRED_FILES"_s) {
            cmExpandList(val, rt.RequiredFiles);
          } else if (key == "RUN_SERIAL"_s) {
            rt.RunSerial = cmIsOn(val);
          } else if (key == "FAIL_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.ErrorRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "SKIP_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.SkipRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "PROCESSORS"_s) {
            rt.Processors = atoi(val.c_str());
            if (rt.Processors < 1) {
              rt.Processors = 1;
            }
          } else if (key == "PROCESSOR_AFFINITY"_s) {
            rt.WantAffinity = cmIsOn(val);
          } else if (key == "RESOURCE_GROUPS"_s) {
            if (!ParseResourceGroupsProperty(val, rt.ResourceGroups)) {
              return false;
            }
          } else if (key == "SKIP_RETURN_CODE"_s) {
            rt.SkipReturnCode = atoi(val.c_str());
            if (rt.SkipReturnCode < 0 || rt.SkipReturnCode > 255) {
              rt.SkipReturnCode = -1;
            }
          } else if (key == "DEPENDS"_s) {
            cmExpandList(val, rt.Depends);
          } else if (key == "ENVIRONMENT"_s) {
            cmExpandList(val, rt.Environment);
          } else if (key == "ENVIRONMENT_MODIFICATION"_s) {
            cmExpandList(val, rt.EnvironmentModification);
          } else if (key == "LABELS"_s) {
            std::vector<std::string> Labels = cmExpandedList(val);
            rt.Labels.insert(rt.Labels.end(), Labels.begin(), Labels.end());
            // sort the array
            std::sort(rt.Labels.begin(), rt.Labels.end());
            // remove duplicates
            auto new_end = std::unique(rt.Labels.begin(), rt.Labels.end());
            rt.Labels.erase(new_end, rt.Labels.end());
          } else if (key == "MEASUREMENT"_s) {
            size_t pos = val.find_first_of('=');
            if (pos != std::string::npos) {
              std::string mKey = val.substr(0, pos);
              std::string mVal = val.substr(pos + 1);
              rt.Measurements[mKey] = std::move(mVal);
            } else {
              rt.Measurements[val] = "1";
            }
          } else if (key == "PASS_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.RequiredRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "WORKING_DIRECTORY"_s) {
            rt.Directory = val;
          } else if (key == "TIMEOUT_AFTER_MATCH"_s) {
            std::vector<std::string> propArgs = cmExpandedList(val);
            if (propArgs.size() != 2) {
              cmCTestLog(this->CTest, WARNING,
                         "TIMEOUT_AFTER_MATCH expects two arguments, found "
                           << propArgs.size() << std::endl);
            } else {
              rt.AlternateTimeout = cmDuration(atof(propArgs[0].c_str()));
              std::vector<std::string> lval = cmExpandedList(propArgs[1]);
              for (std::string const& cr : lval) {
                rt.TimeoutRegularExpressions.emplace_back(cr, cr);
              }
            }
          }
        }
      }
    }
  }
  return true;
}